

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingTable.cpp
# Opt level: O0

bool __thiscall EncodingTable::load(EncodingTable *this,path *fileName,Encoding encoding)

{
  size_type *psVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  undefined1 local_3b8 [4];
  int length_1;
  string value;
  string hex_1;
  size_t pos;
  undefined1 local_368 [4];
  int length;
  string hex;
  string *line;
  undefined1 local_310 [8];
  TextFile input;
  uchar hexBuffer [32];
  Encoding encoding_local;
  path *fileName_local;
  EncodingTable *this_local;
  
  TextFile::TextFile((TextFile *)local_310);
  uVar3 = TextFile::open((TextFile *)local_310,(char *)fileName,0,(ulong)encoding);
  if ((uVar3 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    ByteArray::clear(&this->hexData);
    std::vector<EncodingTable::TableEntry,_std::allocator<EncodingTable::TableEntry>_>::clear
              (&this->entries);
    setTerminationEntry(this,(uchar *)"",1);
    while (bVar2 = TextFile::atEnd((TextFile *)local_310), ((bVar2 ^ 0xffU) & 1) != 0) {
      TextFile::readLine_abi_cxx11_((string *)((long)&hex.field_2 + 8),(TextFile *)local_310);
      psVar1 = &hex.field_2._M_allocated_capacity + 1;
      uVar5 = std::__cxx11::string::empty();
      if (((uVar5 & 1) == 0) &&
         (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)psVar1), *pcVar6 != '*')) {
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)psVar1);
        if (*pcVar6 == '/') {
          std::__cxx11::string::substr((ulong)local_368,(ulong)psVar1);
          uVar5 = std::__cxx11::string::empty();
          if ((((uVar5 & 1) == 0) && (uVar5 = std::__cxx11::string::length(), uVar5 < 0x41)) &&
             (iVar4 = parseHexString((string *)local_368,(uchar *)&input.bufPos), iVar4 != -1)) {
            setTerminationEntry(this,(uchar *)&input.bufPos,(long)iVar4);
          }
          std::__cxx11::string::~string((string *)local_368);
        }
        else {
          std::__cxx11::string::find((char)psVar1,0x3d);
          std::__cxx11::string::substr((ulong)((long)&value.field_2 + 8),(ulong)psVar1);
          std::__cxx11::string::substr((ulong)local_3b8,(ulong)psVar1);
          uVar5 = std::__cxx11::string::empty();
          if (((((uVar5 & 1) == 0) && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) &&
              (uVar5 = std::__cxx11::string::length(), uVar5 < 0x41)) &&
             (iVar4 = parseHexString((string *)((long)&value.field_2 + 8),(uchar *)&input.bufPos),
             iVar4 != -1)) {
            addEntry(this,(uchar *)&input.bufPos,(long)iVar4,(string *)local_3b8);
          }
          std::__cxx11::string::~string((string *)local_3b8);
          std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
        }
      }
      std::__cxx11::string::~string((string *)(hex.field_2._M_local_buf + 8));
    }
    this_local._7_1_ = true;
  }
  TextFile::~TextFile((TextFile *)local_310);
  return this_local._7_1_;
}

Assistant:

bool EncodingTable::load(const fs::path& fileName, TextFile::Encoding encoding)
{
	unsigned char hexBuffer[MAXHEXLENGTH];

	TextFile input;
	if (!input.open(fileName,TextFile::Read,encoding))
		return false;

	hexData.clear();
	entries.clear();
	setTerminationEntry((unsigned char*)"\0",1);

	while (!input.atEnd())
	{
		const std::string &line = input.readLine();
		if (line.empty() || line[0] == '*') continue;
		
		if (line[0] == '/')
		{
			std::string hex = line.substr(1);
			if (hex.empty() || hex.length() > 2*MAXHEXLENGTH)
			{
				// error
				continue;
			}

			int length = parseHexString(hex,hexBuffer);
			if (length == -1)
			{
				// error
				continue;
			}

			setTerminationEntry(hexBuffer,length);
		} else {
			size_t pos = line.find(L'=');
			std::string hex = line.substr(0,pos);
			std::string value = line.substr(pos+1);

			if (hex.empty() || value.empty() || hex.length() > 2*MAXHEXLENGTH)
			{
				// error
				continue;
			}
			
			int length = parseHexString(hex,hexBuffer);
			if (length == -1)
			{
				// error
				continue;
			}

			addEntry(hexBuffer,length,value);
		}
	}

	return true;
}